

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::length2(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *__return_storage_ptr__,
         SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this)

{
  undefined8 uVar1;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_78;
  
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&__return_storage_ptr__->m_backend,0,(type *)0x0);
  if (this->setupStatus == true) {
    if (0 < (this->super_IdxSet).num) {
      lVar2 = 0;
      do {
        v = &(this->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(this->super_IdxSet).idx[lVar2]].m_backend;
        local_78.fpclass = cpp_dec_float_finite;
        local_78.prec_elem = 0x10;
        local_78.data._M_elems[0] = 0;
        local_78.data._M_elems[1] = 0;
        local_78.data._M_elems[2] = 0;
        local_78.data._M_elems[3] = 0;
        local_78.data._M_elems[4] = 0;
        local_78.data._M_elems[5] = 0;
        local_78.data._M_elems[6] = 0;
        local_78.data._M_elems[7] = 0;
        local_78.data._M_elems[8] = 0;
        local_78.data._M_elems[9] = 0;
        local_78.data._M_elems[10] = 0;
        local_78.data._M_elems[0xb] = 0;
        local_78.data._M_elems[0xc] = 0;
        local_78.data._M_elems[0xd] = 0;
        local_78.data._M_elems._56_5_ = 0;
        local_78.data._M_elems[0xf]._1_3_ = 0;
        local_78.exp = 0;
        local_78.neg = false;
        if (&local_78 != v) {
          local_78.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
          local_78.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
          local_78.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
          local_78.data._M_elems._24_8_ = *(undefined8 *)((v->data)._M_elems + 6);
          local_78.data._M_elems._32_8_ = *(undefined8 *)((v->data)._M_elems + 8);
          local_78.data._M_elems._40_8_ = *(undefined8 *)((v->data)._M_elems + 10);
          local_78.data._M_elems._48_8_ = *(undefined8 *)((v->data)._M_elems + 0xc);
          uVar1 = *(undefined8 *)((v->data)._M_elems + 0xe);
          local_78.data._M_elems._56_5_ = SUB85(uVar1,0);
          local_78.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar1 >> 0x28);
          local_78.exp = v->exp;
          local_78.neg = v->neg;
          local_78.fpclass = v->fpclass;
          local_78.prec_elem = v->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=(&local_78,v);
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                  (&__return_storage_ptr__->m_backend,&local_78);
        lVar2 = lVar2 + 1;
      } while (lVar2 < (this->super_IdxSet).num);
    }
  }
  else {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator*((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_78,
                &this->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,&this->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               );
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 0xc) =
         local_78.data._M_elems._48_8_;
    *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_78.data._M_elems[0xf]._1_3_,local_78.data._M_elems._56_5_);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         local_78.data._M_elems._32_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 10) =
         local_78.data._M_elems._40_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
         local_78.data._M_elems._16_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
         local_78.data._M_elems._24_8_;
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = local_78.data._M_elems._0_8_;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
         local_78.data._M_elems._8_8_;
    (__return_storage_ptr__->m_backend).exp = local_78.exp;
    (__return_storage_ptr__->m_backend).neg = local_78.neg;
    (__return_storage_ptr__->m_backend).fpclass = local_78.fpclass;
    (__return_storage_ptr__->m_backend).prec_elem = local_78.prec_elem;
  }
  return __return_storage_ptr__;
}

Assistant:

R length2() const
   {
      R x = 0;

      if(isSetup())
      {
         for(int i = 0; i < num; ++i)
            x += VectorBase<R>::val[idx[i]] * VectorBase<R>::val[idx[i]];
      }
      else
         x = VectorBase<R>::length2();

      return x;
   }